

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O3

void test_insert(CuTest *tc)

{
  int iVar1;
  char *actual;
  critbit_tree cb;
  critbit_tree local_28;
  
  local_28.root = (void *)0x0;
  iVar1 = cb_insert(&local_28,"herpderp",9);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x19,(char *)0x0,0,iVar1);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c"
                ,0x1a,"null pointer unexpected",(uint)(local_28.root != (void *)0x0));
  iVar1 = cb_insert(&local_28,"herpderp",9);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x1d,(char *)0x0,1,iVar1);
  actual = (char *)cb_find(&local_28,"herpderp",9);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x20,(char *)0x0,"herpderp",actual);
  cb_clear(&local_28);
  return;
}

Assistant:

static void test_insert(CuTest * tc)
{
    struct selist *ql = NULL;
    int i;
    for (i = 0; i != 32; ++i) {
        CuAssertIntEquals(tc, i, selist_length(ql));
        selist_insert(&ql, 0, (void *)(lipsum + 31 - i));
    }
    for (i = 0; i != 32; ++i) {
        CuAssertPtrEquals(tc, (void *)(lipsum + i), selist_get(ql, i));
    }
    selist_free(ql);
}